

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

void * Fossilize::build_pnext_chain
                 (VulkanFeatures *features,uint32_t api_version,char **enabled_extensions,
                 uint32_t extension_count)

{
  uint32_t uVar1;
  VulkanFeatures *pVVar2;
  size_type sVar3;
  ulong uVar4;
  void **ppvVar5;
  VulkanFeatures *pVVar6;
  bool bVar7;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabled_extension_set;
  allocator local_95;
  uint32_t local_94;
  value_type local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_70;
  VulkanFeatures *local_38;
  
  local_94 = api_version;
  local_38 = features;
  memset(features,0,0xba8);
  local_70._M_buckets = &local_70._M_single_bucket;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  for (uVar4 = 0; extension_count != uVar4; uVar4 = uVar4 + 1) {
    std::__cxx11::string::string((string *)&local_90,enabled_extensions[uVar4],&local_95);
    std::__detail::
    _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&local_70,&local_90);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_16bit_storage",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  pVVar2 = local_38;
  uVar1 = local_94;
  ppvVar5 = (void **)0x0;
  if (local_94 < 0x400000) {
    pVVar6 = (VulkanFeatures *)0x0;
  }
  else {
    pVVar6 = (VulkanFeatures *)0x0;
    if (sVar3 != 0) {
      (local_38->storage_16bit).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_16BIT_STORAGE_FEATURES;
      ppvVar5 = &(local_38->storage_16bit).pNext;
      pVVar6 = local_38;
    }
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_multiview",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->multiview).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTIVIEW_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->multiview;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->multiview;
    }
    ppvVar5 = &(pVVar2->multiview).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_variable_pointers",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->variable_pointers).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VARIABLE_POINTERS_FEATURES
    ;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->variable_pointers;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->variable_pointers;
    }
    ppvVar5 = &(pVVar2->variable_pointers).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_sampler_ycbcr_conversion",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ycbcr_conversion).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SAMPLER_YCBCR_CONVERSION_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->ycbcr_conversion;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ycbcr_conversion;
    }
    ppvVar5 = &(pVVar2->ycbcr_conversion).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_draw_parameters",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x400fff < uVar1) && (sVar3 != 0)) {
    (pVVar2->draw_parameters).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_DRAW_PARAMETERS_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->draw_parameters;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->draw_parameters;
    }
    ppvVar5 = &(pVVar2->draw_parameters).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_8bit_storage",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->storage_8bit).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_8BIT_STORAGE_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->storage_8bit;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->storage_8bit;
    }
    ppvVar5 = &(pVVar2->storage_8bit).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_atomic_int64",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->atomic_int64).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_INT64_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->atomic_int64;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->atomic_int64;
    }
    ppvVar5 = &(pVVar2->atomic_int64).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_float16_int8",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->float16_int8).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FLOAT16_INT8_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->float16_int8;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->float16_int8;
    }
    ppvVar5 = &(pVVar2->float16_int8).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_descriptor_indexing",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->descriptor_indexing).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->descriptor_indexing;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->descriptor_indexing;
    }
    ppvVar5 = &(pVVar2->descriptor_indexing).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_vulkan_memory_model",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->memory_model).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_MEMORY_MODEL_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->memory_model;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->memory_model;
    }
    ppvVar5 = &(pVVar2->memory_model).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_KHR_uniform_buffer_standard_layout",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ubo_standard_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_UNIFORM_BUFFER_STANDARD_LAYOUT_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->ubo_standard_layout;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ubo_standard_layout;
    }
    ppvVar5 = &(pVVar2->ubo_standard_layout).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_KHR_shader_subgroup_extended_types",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x400fff < uVar1) && (sVar3 != 0)) {
    (pVVar2->subgroup_extended_types).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SUBGROUP_EXTENDED_TYPES_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->subgroup_extended_types;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->subgroup_extended_types;
    }
    ppvVar5 = &(pVVar2->subgroup_extended_types).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_KHR_separate_depth_stencil_layouts",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->separate_ds_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SEPARATE_DEPTH_STENCIL_LAYOUTS_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->separate_ds_layout;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->separate_ds_layout;
    }
    ppvVar5 = &(pVVar2->separate_ds_layout).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_buffer_device_address",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->buffer_device_address).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->buffer_device_address;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->buffer_device_address;
    }
    ppvVar5 = &(pVVar2->buffer_device_address).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_clock",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_clock).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_CLOCK_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_clock;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_clock;
    }
    ppvVar5 = &(pVVar2->shader_clock).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_fragment_shading_rate",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->fragment_shading_rate).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->fragment_shading_rate;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->fragment_shading_rate;
    }
    ppvVar5 = &(pVVar2->fragment_shading_rate).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_ray_tracing_pipeline",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ray_tracing_pipeline).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_PIPELINE_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->ray_tracing_pipeline;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ray_tracing_pipeline;
    }
    ppvVar5 = &(pVVar2->ray_tracing_pipeline).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_acceleration_structure",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->acceleration_structure).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ACCELERATION_STRUCTURE_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->acceleration_structure;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->acceleration_structure;
    }
    ppvVar5 = &(pVVar2->acceleration_structure).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_ray_query",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ray_query).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_QUERY_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->ray_query;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ray_query;
    }
    ppvVar5 = &(pVVar2->ray_query).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_KHR_workgroup_memory_explicit_layout",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->workgroup_memory_explicit_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_WORKGROUP_MEMORY_EXPLICIT_LAYOUT_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->workgroup_memory_explicit_layout;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->workgroup_memory_explicit_layout;
    }
    ppvVar5 = &(pVVar2->workgroup_memory_explicit_layout).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_integer_dot_product",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_integer_dot_product).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_INTEGER_DOT_PRODUCT_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_integer_dot_product;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_integer_dot_product;
    }
    ppvVar5 = &(pVVar2->shader_integer_dot_product).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_synchronization2",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->synchronization2).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SYNCHRONIZATION_2_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->synchronization2;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->synchronization2;
    }
    ppvVar5 = &(pVVar2->synchronization2).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_dynamic_rendering",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->dynamic_rendering).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES
    ;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->dynamic_rendering;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->dynamic_rendering;
    }
    ppvVar5 = &(pVVar2->dynamic_rendering).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_KHR_zero_initialize_workgroup_memory",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->zero_initialize_workgroup_memory).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ZERO_INITIALIZE_WORKGROUP_MEMORY_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->zero_initialize_workgroup_memory;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->zero_initialize_workgroup_memory;
    }
    ppvVar5 = &(pVVar2->zero_initialize_workgroup_memory).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_transform_feedback",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->transform_feedback).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_TRANSFORM_FEEDBACK_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->transform_feedback;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->transform_feedback;
    }
    ppvVar5 = &(pVVar2->transform_feedback).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_depth_clip_enable",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->depth_clip).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLIP_ENABLE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->depth_clip;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->depth_clip;
    }
    ppvVar5 = &(pVVar2->depth_clip).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_inline_uniform_block",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->inline_uniform_block).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_INLINE_UNIFORM_BLOCK_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->inline_uniform_block;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->inline_uniform_block;
    }
    ppvVar5 = &(pVVar2->inline_uniform_block).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_blend_operation_advanced",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->blend_operation_advanced).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BLEND_OPERATION_ADVANCED_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->blend_operation_advanced;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->blend_operation_advanced;
    }
    ppvVar5 = &(pVVar2->blend_operation_advanced).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_vertex_attribute_divisor",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if (sVar3 == 0) {
    std::__cxx11::string::string((string *)&local_90,"VK_EXT_vertex_attribute_divisor",&local_95);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&local_70,&local_90);
    bVar7 = sVar3 == 0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar7 = false;
  }
  uVar1 = local_94;
  if ((0x3fffff < local_94) && (!bVar7)) {
    (pVVar2->attribute_divisor).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_ATTRIBUTE_DIVISOR_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->attribute_divisor;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->attribute_divisor;
    }
    ppvVar5 = &(pVVar2->attribute_divisor).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_EXT_shader_demote_to_helper_invocation",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->demote_to_helper).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_DEMOTE_TO_HELPER_INVOCATION_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->demote_to_helper;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->demote_to_helper;
    }
    ppvVar5 = &(pVVar2->demote_to_helper).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_fragment_shader_interlock",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_interlock).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADER_INTERLOCK_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_interlock;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_interlock;
    }
    ppvVar5 = &(pVVar2->shader_interlock).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_fragment_density_map",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->fragment_density).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_DENSITY_MAP_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->fragment_density;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->fragment_density;
    }
    ppvVar5 = &(pVVar2->fragment_density).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_buffer_device_address",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->buffer_device_address_ext).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_ADDRESS_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->buffer_device_address_ext;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->buffer_device_address_ext;
    }
    ppvVar5 = &(pVVar2->buffer_device_address_ext).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_line_rasterization",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if (sVar3 == 0) {
    std::__cxx11::string::string((string *)&local_90,"VK_EXT_line_rasterization",&local_95);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&local_70,&local_90);
    bVar7 = sVar3 == 0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar7 = false;
  }
  uVar1 = local_94;
  if ((0x3fffff < local_94) && (!bVar7)) {
    (pVVar2->line_rasterization).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_LINE_RASTERIZATION_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->line_rasterization;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->line_rasterization;
    }
    ppvVar5 = &(pVVar2->line_rasterization).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_subgroup_size_control",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->subgroup_size_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_SIZE_CONTROL_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->subgroup_size_control;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->subgroup_size_control;
    }
    ppvVar5 = &(pVVar2->subgroup_size_control).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_extended_dynamic_state",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->extended_dynamic_state).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->extended_dynamic_state;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->extended_dynamic_state;
    }
    ppvVar5 = &(pVVar2->extended_dynamic_state).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_extended_dynamic_state2",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->extended_dynamic_state2).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_2_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->extended_dynamic_state2;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->extended_dynamic_state2;
    }
    ppvVar5 = &(pVVar2->extended_dynamic_state2).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_extended_dynamic_state3",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->extended_dynamic_state3).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_3_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->extended_dynamic_state3;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->extended_dynamic_state3;
    }
    ppvVar5 = &(pVVar2->extended_dynamic_state3).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_color_write_enable",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->color_write_enable).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COLOR_WRITE_ENABLE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->color_write_enable;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->color_write_enable;
    }
    ppvVar5 = &(pVVar2->color_write_enable).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_vertex_input_dynamic_state",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->vertex_input_dynamic_state).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_INPUT_DYNAMIC_STATE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->vertex_input_dynamic_state;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->vertex_input_dynamic_state;
    }
    ppvVar5 = &(pVVar2->vertex_input_dynamic_state).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_image_atomic_int64",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_image_atomic_int64).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_IMAGE_ATOMIC_INT64_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_image_atomic_int64;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_image_atomic_int64;
    }
    ppvVar5 = &(pVVar2->shader_image_atomic_int64).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_atomic_float",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_atomic_float).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_FLOAT_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_atomic_float;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_atomic_float;
    }
    ppvVar5 = &(pVVar2->shader_atomic_float).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_atomic_float2",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_atomic_float2).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_FLOAT_2_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_atomic_float2;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_atomic_float2;
    }
    ppvVar5 = &(pVVar2->shader_atomic_float2).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_provoking_vertex",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->provoking_vertex).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROVOKING_VERTEX_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->provoking_vertex;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->provoking_vertex;
    }
    ppvVar5 = &(pVVar2->provoking_vertex).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_custom_border_color",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->custom_border_color).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_CUSTOM_BORDER_COLOR_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->custom_border_color;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->custom_border_color;
    }
    ppvVar5 = &(pVVar2->custom_border_color).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_compute_shader_derivatives",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if (sVar3 == 0) {
    std::__cxx11::string::string((string *)&local_90,"VK_NV_compute_shader_derivatives",&local_95);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&local_70,&local_90);
    bVar7 = sVar3 == 0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar7 = false;
  }
  uVar1 = local_94;
  if ((0x3fffff < local_94) && (!bVar7)) {
    (pVVar2->compute_shader_derivatives).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COMPUTE_SHADER_DERIVATIVES_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->compute_shader_derivatives;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->compute_shader_derivatives;
    }
    ppvVar5 = &(pVVar2->compute_shader_derivatives).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_fragment_shader_barycentric",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->barycentric).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADER_BARYCENTRIC_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->barycentric;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->barycentric;
    }
    ppvVar5 = &(pVVar2->barycentric).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_shader_image_footprint",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->image_footprint_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_IMAGE_FOOTPRINT_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->image_footprint_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->image_footprint_nv;
    }
    ppvVar5 = &(pVVar2->image_footprint_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_shading_rate_image",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shading_rate_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADING_RATE_IMAGE_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shading_rate_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shading_rate_nv;
    }
    ppvVar5 = &(pVVar2->shading_rate_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_cooperative_matrix",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->cooperative_matrix_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COOPERATIVE_MATRIX_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->cooperative_matrix_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->cooperative_matrix_nv;
    }
    ppvVar5 = &(pVVar2->cooperative_matrix_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_shader_sm_builtins",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->sm_builtins_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SM_BUILTINS_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->sm_builtins_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->sm_builtins_nv;
    }
    ppvVar5 = &(pVVar2->sm_builtins_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_INTEL_shader_integer_functions2",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->integer_functions2_intel).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_INTEGER_FUNCTIONS_2_FEATURES_INTEL;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->integer_functions2_intel;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->integer_functions2_intel;
    }
    ppvVar5 = &(pVVar2->integer_functions2_intel).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_mutable_descriptor_type",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if (sVar3 == 0) {
    std::__cxx11::string::string((string *)&local_90,"VK_VALVE_mutable_descriptor_type",&local_95);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&local_70,&local_90);
    bVar7 = sVar3 == 0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar7 = false;
  }
  uVar1 = local_94;
  if ((0x3fffff < local_94) && (!bVar7)) {
    (pVVar2->mutable_descriptor_type).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->mutable_descriptor_type;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->mutable_descriptor_type;
    }
    ppvVar5 = &(pVVar2->mutable_descriptor_type).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_robustness2",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->robustness2).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->robustness2;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->robustness2;
    }
    ppvVar5 = &(pVVar2->robustness2).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_image_robustness",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->image_robustness).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->image_robustness;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->image_robustness;
    }
    ppvVar5 = &(pVVar2->image_robustness).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_graphics_pipeline_library",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->graphics_pipeline_library).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_GRAPHICS_PIPELINE_LIBRARY_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->graphics_pipeline_library;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->graphics_pipeline_library;
    }
    ppvVar5 = &(pVVar2->graphics_pipeline_library).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_fragment_shading_rate_enums",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->fragment_shading_rate_enums).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->fragment_shading_rate_enums;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->fragment_shading_rate_enums;
    }
    ppvVar5 = &(pVVar2->fragment_shading_rate_enums).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_depth_clip_control",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->depth_clip_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLIP_CONTROL_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->depth_clip_control;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->depth_clip_control;
    }
    ppvVar5 = &(pVVar2->depth_clip_control).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_mesh_shader",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->mesh_shader_nv).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->mesh_shader_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->mesh_shader_nv;
    }
    ppvVar5 = &(pVVar2->mesh_shader_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_mesh_shader",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->mesh_shader).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->mesh_shader;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->mesh_shader;
    }
    ppvVar5 = &(pVVar2->mesh_shader).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_descriptor_buffer",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->descriptor_buffer).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->descriptor_buffer;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->descriptor_buffer;
    }
    ppvVar5 = &(pVVar2->descriptor_buffer).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_non_seamless_cube_map",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->non_seamless_cube_map).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_NON_SEAMLESS_CUBE_MAP_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->non_seamless_cube_map;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->non_seamless_cube_map;
    }
    ppvVar5 = &(pVVar2->non_seamless_cube_map).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_EXT_attachment_feedback_loop_layout",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->attachment_feedback_loop_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ATTACHMENT_FEEDBACK_LOOP_LAYOUT_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->attachment_feedback_loop_layout;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->attachment_feedback_loop_layout;
    }
    ppvVar5 = &(pVVar2->attachment_feedback_loop_layout).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_maintenance4",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->maintenance4).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_4_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->maintenance4;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->maintenance4;
    }
    ppvVar5 = &(pVVar2->maintenance4).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_maintenance5",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->maintenance5).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_5_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->maintenance5;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->maintenance5;
    }
    ppvVar5 = &(pVVar2->maintenance5).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_maintenance7",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->maintenance7).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_7_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->maintenance7;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->maintenance7;
    }
    ppvVar5 = &(pVVar2->maintenance7).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_module_identifier",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_module_identifier).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_module_identifier;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_module_identifier;
    }
    ppvVar5 = &(pVVar2->shader_module_identifier).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_ray_tracing_maintenance1",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ray_tracing_maintenance1).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_MAINTENANCE_1_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->ray_tracing_maintenance1;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ray_tracing_maintenance1;
    }
    ppvVar5 = &(pVVar2->ray_tracing_maintenance1).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_ray_tracing_motion_blur",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ray_tracing_motion_blur_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_MOTION_BLUR_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->ray_tracing_motion_blur_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ray_tracing_motion_blur_nv;
    }
    ppvVar5 = &(pVVar2->ray_tracing_motion_blur_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_QCOM_image_processing",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->image_processing_qcom).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_PROCESSING_FEATURES_QCOM;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->image_processing_qcom;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->image_processing_qcom;
    }
    ppvVar5 = &(pVVar2->image_processing_qcom).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_QCOM_image_processing2",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->image_processing2_qcom).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_PROCESSING_2_FEATURES_QCOM;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->image_processing2_qcom;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->image_processing2_qcom;
    }
    ppvVar5 = &(pVVar2->image_processing2_qcom).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_ARM_shader_core_builtins",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_core_builtins_arm).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_CORE_BUILTINS_FEATURES_ARM;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_core_builtins_arm;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_core_builtins_arm;
    }
    ppvVar5 = &(pVVar2->shader_core_builtins_arm).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_ray_tracing_position_fetch",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ray_tracing_position_fetch).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_POSITION_FETCH_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->ray_tracing_position_fetch;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ray_tracing_position_fetch;
    }
    ppvVar5 = &(pVVar2->ray_tracing_position_fetch).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_tile_image",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_tile_image).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_TILE_IMAGE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_tile_image;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_tile_image;
    }
    ppvVar5 = &(pVVar2->shader_tile_image).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_cooperative_matrix",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->cooperative_matrix).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COOPERATIVE_MATRIX_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->cooperative_matrix;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->cooperative_matrix;
    }
    ppvVar5 = &(pVVar2->cooperative_matrix).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_subgroup_rotate",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_subgroup_rotate).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SUBGROUP_ROTATE_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_subgroup_rotate;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_subgroup_rotate;
    }
    ppvVar5 = &(pVVar2->shader_subgroup_rotate).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_expect_assume",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->expect_assume).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_EXPECT_ASSUME_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->expect_assume;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->expect_assume;
    }
    ppvVar5 = &(pVVar2->expect_assume).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_float_controls2",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_float_controls2).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_FLOAT_CONTROLS_2_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_float_controls2;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_float_controls2;
    }
    ppvVar5 = &(pVVar2->shader_float_controls2).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_quad_control",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_quad_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_QUAD_CONTROL_FEATURES_KHR;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_quad_control;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_quad_control;
    }
    ppvVar5 = &(pVVar2->shader_quad_control).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_raw_access_chains",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->raw_access_chains_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAW_ACCESS_CHAINS_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->raw_access_chains_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->raw_access_chains_nv;
    }
    ppvVar5 = &(pVVar2->raw_access_chains_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_replicated_composites",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_replicated_composites).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_REPLICATED_COMPOSITES_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_replicated_composites;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_replicated_composites;
    }
    ppvVar5 = &(pVVar2->shader_replicated_composites).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_pipeline_robustness",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->pipeline_robustness).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_ROBUSTNESS_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->pipeline_robustness;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->pipeline_robustness;
    }
    ppvVar5 = &(pVVar2->pipeline_robustness).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_conditional_rendering",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->conditional_rendering).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_CONDITIONAL_RENDERING_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->conditional_rendering;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->conditional_rendering;
    }
    ppvVar5 = &(pVVar2->conditional_rendering).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_dynamic_rendering_local_read",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->dynamic_rendering_local_read).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_LOCAL_READ_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->dynamic_rendering_local_read;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->dynamic_rendering_local_read;
    }
    ppvVar5 = &(pVVar2->dynamic_rendering_local_read).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_EXT_rasterization_order_attachment_access",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if (sVar3 == 0) {
    std::__cxx11::string::string
              ((string *)&local_90,"VK_ARM_rasterization_order_attachment_access",&local_95);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&local_70,&local_90);
    bVar7 = sVar3 == 0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar7 = false;
  }
  uVar1 = local_94;
  if ((0x3fffff < local_94) && (!bVar7)) {
    (pVVar2->rasterization_order_attachment_access).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_FEATURES_ARM;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->rasterization_order_attachment_access;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->rasterization_order_attachment_access;
    }
    ppvVar5 = &(pVVar2->rasterization_order_attachment_access).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_device_generated_commands",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->device_generated_commands_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->device_generated_commands_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->device_generated_commands_nv;
    }
    ppvVar5 = &(pVVar2->device_generated_commands_nv).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_NV_device_generated_commands_compute",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->device_generated_commands_compute_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_COMPUTE_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->device_generated_commands_compute_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->device_generated_commands_compute_nv;
    }
    ppvVar5 = &(pVVar2->device_generated_commands_compute_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_optical_flow",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->optical_flow_nv).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_OPTICAL_FLOW_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->optical_flow_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->optical_flow_nv;
    }
    ppvVar5 = &(pVVar2->optical_flow_nv).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_legacy_dithering",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->legacy_dithering).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_LEGACY_DITHERING_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->legacy_dithering;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->legacy_dithering;
    }
    ppvVar5 = &(pVVar2->legacy_dithering).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_pipeline_protected_access",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->pipeline_protected_access).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_PROTECTED_ACCESS_FEATURES;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->pipeline_protected_access;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->pipeline_protected_access;
    }
    ppvVar5 = &(pVVar2->pipeline_protected_access).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_NV_per_stage_descriptor_set",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->per_stage_descriptor_set_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PER_STAGE_DESCRIPTOR_SET_FEATURES_NV;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->per_stage_descriptor_set_nv;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->per_stage_descriptor_set_nv;
    }
    ppvVar5 = &(pVVar2->per_stage_descriptor_set_nv).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_EXT_attachment_feedback_loop_dynamic_state",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->attachment_feedback_loop_dynamic_state).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ATTACHMENT_FEEDBACK_LOOP_DYNAMIC_STATE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->attachment_feedback_loop_dynamic_state;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->attachment_feedback_loop_dynamic_state;
    }
    ppvVar5 = &(pVVar2->attachment_feedback_loop_dynamic_state).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_subpass_merge_feedback",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->subpass_merge_feedback).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBPASS_MERGE_FEEDBACK_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->subpass_merge_feedback;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->subpass_merge_feedback;
    }
    ppvVar5 = &(pVVar2->subpass_merge_feedback).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_border_color_swizzle",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->border_color_swizzle).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BORDER_COLOR_SWIZZLE_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->border_color_swizzle;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->border_color_swizzle;
    }
    ppvVar5 = &(pVVar2->border_color_swizzle).pNext;
  }
  std::__cxx11::string::string
            ((string *)&local_90,"VK_EXT_multisampled_render_to_single_sampled",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->multisampled_render_to_single_sampled).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->multisampled_render_to_single_sampled;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->multisampled_render_to_single_sampled;
    }
    ppvVar5 = &(pVVar2->multisampled_render_to_single_sampled).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_depth_bias_control",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->depth_bias_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_BIAS_CONTROL_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->depth_bias_control;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->depth_bias_control;
    }
    ppvVar5 = &(pVVar2->depth_bias_control).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_depth_clamp_control",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->depth_clamp_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLAMP_CONTROL_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->depth_clamp_control;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->depth_clamp_control;
    }
    ppvVar5 = &(pVVar2->depth_clamp_control).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_device_generated_commands",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->device_generated_commands).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->device_generated_commands;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->device_generated_commands;
    }
    ppvVar5 = &(pVVar2->device_generated_commands).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_object",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_object).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->shader_object;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_object;
    }
    ppvVar5 = &(pVVar2->shader_object).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_primitives_generated_query",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->primitives_generated_query).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->primitives_generated_query;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->primitives_generated_query;
    }
    ppvVar5 = &(pVVar2->primitives_generated_query).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_image_2d_view_of_3d",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->image_2d_view_of_3d).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->image_2d_view_of_3d;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->image_2d_view_of_3d;
    }
    ppvVar5 = &(pVVar2->image_2d_view_of_3d).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_opacity_micromap",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_70,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->opacity_micromap).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_OPACITY_MICROMAP_FEATURES_EXT;
    if (pVVar6 == (VulkanFeatures *)0x0) {
      pVVar6 = (VulkanFeatures *)&pVVar2->opacity_micromap;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->opacity_micromap;
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_70);
  return pVVar6;
}

Assistant:

void *build_pnext_chain(VulkanFeatures &features, uint32_t api_version,
                        const char **enabled_extensions, uint32_t extension_count)
{
	features = {};
	void *pNext = nullptr;
	void **ppNext = nullptr;

	std::unordered_set<std::string> enabled_extension_set;
	for (uint32_t i = 0; i < extension_count; i++)
		enabled_extension_set.insert(enabled_extensions[i]);

#define CHAIN(struct_type, member, min_api_version, required_extension, required_extension_alias) \
	do { \
        bool is_minimum_api_version = api_version >= min_api_version; \
		bool supports_extension = enabled_extension_set.count(required_extension) != 0; \
        if (!supports_extension && required_extension_alias) \
			supports_extension = enabled_extension_set.count(required_extension_alias) != 0; \
		if (is_minimum_api_version && supports_extension) { \
			member.sType = struct_type; \
			if (!pNext) pNext = &member; \
			if (ppNext) *ppNext = &member; \
			ppNext = &member.pNext; \
		} \
	} while (0)

#define F(struct_type, member, minimum_api_version, required_extension) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES, features.member, \
	VK_API_VERSION_##minimum_api_version, VK_##required_extension##_EXTENSION_NAME, nullptr)
#define FE(struct_type, member, ext) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext, features.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, nullptr)
#define FE_ALIAS(struct_type, member, ext, ext_alias) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext, features.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, VK_##ext_alias##_##struct_type##_EXTENSION_NAME)

#include "fossilize_feature_filter_features.inc"

#undef CHAIN
#undef F
#undef FE
#undef FE_ALIAS

	return pNext;
}